

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadSceneNode(ColladaParser *this,Node *pNode)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Node *pNVar4;
  mapped_type *ppNVar5;
  undefined4 extraout_var;
  Logger *pLVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pCVar7;
  allocator<char> local_79;
  Node *child;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
  *local_58;
  string *local_50;
  vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_> *local_48;
  vector<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_> *local_40;
  NodeLibrary *local_38;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    local_50 = &pNode->mPrimaryCamera;
    local_58 = &pNode->mCameras;
    local_48 = &pNode->mLights;
    local_40 = &pNode->mNodeInstances;
    local_38 = &this->mNodeLibrary;
LAB_003f8fc7:
    do {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar2 == '\0') {
        return;
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        bVar1 = IsElement(this,"node");
        if (bVar1) {
          pNVar4 = (Node *)operator_new(0x118);
          Collada::Node::Node(pNVar4);
          child = pNVar4;
          uVar3 = TestAttribute(this,"id");
          if (-1 < (int)uVar3) {
            (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
            std::__cxx11::string::assign((char *)&child->mID);
          }
          uVar3 = TestAttribute(this,"sid");
          if (-1 < (int)uVar3) {
            (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
            std::__cxx11::string::assign((char *)&child->mSID);
          }
          uVar3 = TestAttribute(this,"name");
          if (-1 < (int)uVar3) {
            (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
            std::__cxx11::string::assign((char *)child);
          }
          pNVar4 = child;
          if (pNode == (Node *)0x0) {
            ppNVar5 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>_>
                      ::operator[](local_38,&child->mID);
            *ppNVar5 = pNVar4;
          }
          else {
            std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::
            push_back(&pNode->mChildren,(value_type *)&child);
            child->mParent = pNode;
          }
          ReadSceneNode(this,child);
          goto LAB_003f8fc7;
        }
        if (pNode != (Node *)0x0) {
          bVar1 = IsElement(this,"lookat");
          if (bVar1) {
            ReadNodeTransformation(this,pNode,TF_LOOKAT);
          }
          else {
            bVar1 = IsElement(this,"matrix");
            if (bVar1) {
              ReadNodeTransformation(this,pNode,TF_MATRIX);
            }
            else {
              bVar1 = IsElement(this,"rotate");
              if (bVar1) {
                ReadNodeTransformation(this,pNode,TF_ROTATE);
              }
              else {
                bVar1 = IsElement(this,"scale");
                if (bVar1) {
                  ReadNodeTransformation(this,pNode,TF_SCALE);
                }
                else {
                  bVar1 = IsElement(this,"skew");
                  if (bVar1) {
                    ReadNodeTransformation(this,pNode,TF_SKEW);
                  }
                  else {
                    bVar1 = IsElement(this,"translate");
                    if (!bVar1) {
                      bVar1 = IsElement(this,"render");
                      if (((bVar1) && (pNode->mParent == (Node *)0x0)) &&
                         ((pNode->mPrimaryCamera)._M_string_length == 0)) {
                        uVar3 = TestAttribute(this,"camera_node");
                        if (uVar3 != 0xffffffff) {
                          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                            (this->mReader,(ulong)uVar3);
                          if (*(char *)CONCAT44(extraout_var_01,iVar2) == '#') {
                            std::__cxx11::string::assign((char *)local_50);
                          }
                          else {
                            pLVar6 = DefaultLogger::get();
                            Logger::error(pLVar6,"Collada: Unresolved reference format of camera");
                          }
                        }
                        goto LAB_003f8fc7;
                      }
                      bVar1 = IsElement(this,"instance_node");
                      if (bVar1) {
                        uVar3 = TestAttribute(this,"url");
                        if (uVar3 == 0xffffffff) goto LAB_003f8fc7;
                        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3)
                        ;
                        if (*(char *)CONCAT44(extraout_var,iVar2) != '#') {
                          pLVar6 = DefaultLogger::get();
                          Logger::error(pLVar6,"Collada: Unresolved reference format of node");
                          goto LAB_003f8fc7;
                        }
                        child = (Node *)&local_68;
                        local_68._M_allocated_capacity = 0;
                        local_68._8_8_ = 0;
                        local_70 = 0;
                        std::
                        vector<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
                        ::emplace_back<Assimp::Collada::NodeInstance>
                                  (local_40,(NodeInstance *)&child);
                        std::__cxx11::string::~string((string *)&child);
                        pCVar7 = (pointer)(pNode->mNodeInstances).
                                          super__Vector_base<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
                                          ._M_impl.super__Vector_impl_data._M_finish;
                      }
                      else {
                        bVar1 = IsElement(this,"instance_geometry");
                        if ((bVar1) || (bVar1 = IsElement(this,"instance_controller"), bVar1)) {
                          ReadNodeGeometry(this,pNode);
                          goto LAB_003f8fc7;
                        }
                        bVar1 = IsElement(this,"instance_light");
                        if (bVar1) {
                          uVar3 = TestAttribute(this,"url");
                          if (uVar3 == 0xffffffff) {
                            pLVar6 = DefaultLogger::get();
                            Logger::warn(pLVar6,
                                         "Collada: Expected url attribute in <instance_light> element"
                                        );
                            goto LAB_003f8fc7;
                          }
                          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                            (this->mReader,(ulong)uVar3);
                          if (*(char *)CONCAT44(extraout_var_00,iVar2) != '#') {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&child,
                                       "Unknown reference format in <instance_light> element",
                                       &local_79);
                            ThrowException(this,(string *)&child);
                          }
                          child = (Node *)&local_68;
                          local_68._M_allocated_capacity = 0;
                          local_68._8_8_ = 0;
                          local_70 = 0;
                          std::
                          vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>
                          ::emplace_back<Assimp::Collada::LightInstance>
                                    (local_48,(LightInstance *)&child);
                          std::__cxx11::string::~string((string *)&child);
                          pCVar7 = (pointer)(pNode->mLights).
                                            super__Vector_base<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>
                                            ._M_impl.super__Vector_impl_data._M_finish;
                        }
                        else {
                          bVar1 = IsElement(this,"instance_camera");
                          if (!bVar1) {
                            SkipElement(this);
                            goto LAB_003f8fc7;
                          }
                          uVar3 = TestAttribute(this,"url");
                          if (uVar3 == 0xffffffff) {
                            pLVar6 = DefaultLogger::get();
                            Logger::warn(pLVar6,
                                         "Collada: Expected url attribute in <instance_camera> element"
                                        );
                            goto LAB_003f8fc7;
                          }
                          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                            (this->mReader,(ulong)uVar3);
                          if (*(char *)CONCAT44(extraout_var_02,iVar2) != '#') {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&child,
                                       "Unknown reference format in <instance_camera> element",
                                       &local_79);
                            ThrowException(this,(string *)&child);
                          }
                          child = (Node *)&local_68;
                          local_68._M_allocated_capacity = 0;
                          local_68._8_8_ = 0;
                          local_70 = 0;
                          std::
                          vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
                          ::emplace_back<Assimp::Collada::CameraInstance>
                                    (local_58,(CameraInstance *)&child);
                          std::__cxx11::string::~string((string *)&child);
                          pCVar7 = (pNode->mCameras).
                                   super__Vector_base<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        }
                      }
                      std::__cxx11::string::assign((char *)(pCVar7 + -1));
                      goto LAB_003f8fc7;
                    }
                    ReadNodeTransformation(this,pNode,TF_TRANSLATE);
                  }
                }
              }
            }
          }
        }
        goto LAB_003f8fc7;
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
  }
  return;
}

Assistant:

void ColladaParser::ReadSceneNode(Node* pNode)
{
    // quit immediately on <bla/> elements
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("node"))
            {
                Node* child = new Node;
                int attrID = TestAttribute("id");
                if (attrID > -1)
                    child->mID = mReader->getAttributeValue(attrID);
                int attrSID = TestAttribute("sid");
                if (attrSID > -1)
                    child->mSID = mReader->getAttributeValue(attrSID);

                int attrName = TestAttribute("name");
                if (attrName > -1)
                    child->mName = mReader->getAttributeValue(attrName);

                // TODO: (thom) support SIDs
                // ai_assert( TestAttribute( "sid") == -1);

                if (pNode)
                {
                    pNode->mChildren.push_back(child);
                    child->mParent = pNode;
                }
                else
                {
                    // no parent node given, probably called from <library_nodes> element.
                    // create new node in node library
                    mNodeLibrary[child->mID] = child;
                }

                // read on recursively from there
                ReadSceneNode(child);
                continue;
            }
            // For any further stuff we need a valid node to work on
            else if (!pNode)
                continue;

            if (IsElement("lookat"))
                ReadNodeTransformation(pNode, TF_LOOKAT);
            else if (IsElement("matrix"))
                ReadNodeTransformation(pNode, TF_MATRIX);
            else if (IsElement("rotate"))
                ReadNodeTransformation(pNode, TF_ROTATE);
            else if (IsElement("scale"))
                ReadNodeTransformation(pNode, TF_SCALE);
            else if (IsElement("skew"))
                ReadNodeTransformation(pNode, TF_SKEW);
            else if (IsElement("translate"))
                ReadNodeTransformation(pNode, TF_TRANSLATE);
            else if (IsElement("render") && pNode->mParent == NULL && 0 == pNode->mPrimaryCamera.length())
            {
                // ... scene evaluation or, in other words, postprocessing pipeline,
                // or, again in other words, a turing-complete description how to
                // render a Collada scene. The only thing that is interesting for
                // us is the primary camera.
                int attrId = TestAttribute("camera_node");
                if (-1 != attrId)
                {
                    const char* s = mReader->getAttributeValue(attrId);
                    if (s[0] != '#')
                        ASSIMP_LOG_ERROR("Collada: Unresolved reference format of camera");
                    else
                        pNode->mPrimaryCamera = s + 1;
                }
            }
            else if (IsElement("instance_node"))
            {
                // find the node in the library
                int attrID = TestAttribute("url");
                if (attrID != -1)
                {
                    const char* s = mReader->getAttributeValue(attrID);
                    if (s[0] != '#')
                        ASSIMP_LOG_ERROR("Collada: Unresolved reference format of node");
                    else
                    {
                        pNode->mNodeInstances.push_back(NodeInstance());
                        pNode->mNodeInstances.back().mNode = s + 1;
                    }
                }
            }
            else if (IsElement("instance_geometry") || IsElement("instance_controller"))
            {
                // Reference to a mesh or controller, with possible material associations
                ReadNodeGeometry(pNode);
            }
            else if (IsElement("instance_light"))
            {
                // Reference to a light, name given in 'url' attribute
                int attrID = TestAttribute("url");
                if (-1 == attrID)
                    ASSIMP_LOG_WARN("Collada: Expected url attribute in <instance_light> element");
                else
                {
                    const char* url = mReader->getAttributeValue(attrID);
                    if (url[0] != '#')
                        ThrowException("Unknown reference format in <instance_light> element");

                    pNode->mLights.push_back(LightInstance());
                    pNode->mLights.back().mLight = url + 1;
                }
            }
            else if (IsElement("instance_camera"))
            {
                // Reference to a camera, name given in 'url' attribute
                int attrID = TestAttribute("url");
                if (-1 == attrID)
                    ASSIMP_LOG_WARN("Collada: Expected url attribute in <instance_camera> element");
                else
                {
                    const char* url = mReader->getAttributeValue(attrID);
                    if (url[0] != '#')
                        ThrowException("Unknown reference format in <instance_camera> element");

                    pNode->mCameras.push_back(CameraInstance());
                    pNode->mCameras.back().mCamera = url + 1;
                }
            }
            else
            {
                // skip everything else for the moment
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            break;
        }
    }
}